

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

int png_deflate_claim(png_structrp png_ptr,png_uint_32 owner,png_alloc_size_t data_size)

{
  int iVar1;
  uint local_84;
  int local_80;
  uint half_window_size;
  int ret;
  int strategy;
  int memLevel;
  int windowBits;
  int method;
  int level;
  char msg [64];
  png_alloc_size_t data_size_local;
  png_uint_32 owner_local;
  png_structrp png_ptr_local;
  
  msg._56_8_ = data_size;
  if (png_ptr->zowner != 0) {
    method._0_1_ = (undefined1)(owner >> 0x18);
    method._1_1_ = (undefined1)(owner >> 0x10);
    method._2_1_ = (undefined1)(owner >> 8);
    method._3_1_ = (undefined1)owner;
    level._0_1_ = 0x3a;
    level._1_1_ = 0x20;
    level._2_1_ = (undefined1)(png_ptr->zowner >> 0x18);
    level._3_1_ = (undefined1)(png_ptr->zowner >> 0x10);
    msg[0] = (char)(png_ptr->zowner >> 8);
    msg[1] = (char)png_ptr->zowner;
    png_safecat((png_charp)&method,0x40,10," using zstream");
    png_warning(png_ptr,(png_const_charp)&method);
    if (png_ptr->zowner == 0x49444154) {
      (png_ptr->zstream).msg = "in use by IDAT";
      return -2;
    }
    png_ptr->zowner = 0;
  }
  windowBits = png_ptr->zlib_level;
  memLevel = png_ptr->zlib_method;
  strategy = png_ptr->zlib_window_bits;
  ret = png_ptr->zlib_mem_level;
  if (owner == 0x49444154) {
    if ((png_ptr->flags & 1) == 0) {
      half_window_size = (uint)(png_ptr->do_filter != '\b');
    }
    else {
      half_window_size = png_ptr->zlib_strategy;
    }
  }
  else {
    windowBits = png_ptr->zlib_text_level;
    memLevel = png_ptr->zlib_text_method;
    strategy = png_ptr->zlib_text_window_bits;
    ret = png_ptr->zlib_text_mem_level;
    half_window_size = png_ptr->zlib_text_strategy;
  }
  if ((ulong)msg._56_8_ < 0x4001) {
    for (local_84 = 1 << ((char)strategy - 1U & 0x1f); msg._56_8_ + 0x106 <= (ulong)local_84;
        local_84 = local_84 >> 1) {
      strategy = strategy + -1;
    }
  }
  if (((png_ptr->flags & 2) != 0) &&
     ((((png_ptr->zlib_set_level != windowBits || (png_ptr->zlib_set_method != memLevel)) ||
       (png_ptr->zlib_set_window_bits != strategy)) ||
      ((png_ptr->zlib_set_mem_level != ret || (png_ptr->zlib_set_strategy != half_window_size))))))
  {
    iVar1 = deflateEnd(&png_ptr->zstream);
    if (iVar1 != 0) {
      png_warning(png_ptr,"deflateEnd failed (ignored)");
    }
    png_ptr->flags = png_ptr->flags & 0xfffffffd;
  }
  (png_ptr->zstream).next_in = (uchar *)0x0;
  (png_ptr->zstream).avail_in = 0;
  (png_ptr->zstream).next_out = (uchar *)0x0;
  (png_ptr->zstream).avail_out = 0;
  if ((png_ptr->flags & 2) == 0) {
    local_80 = deflateInit2_(&png_ptr->zstream,windowBits,memLevel,strategy,ret,half_window_size,
                             "1.3.1.zlib-ng",0x70);
    if (local_80 == 0) {
      png_ptr->flags = png_ptr->flags | 2;
    }
  }
  else {
    local_80 = deflateReset(&png_ptr->zstream);
  }
  if (local_80 == 0) {
    png_ptr->zowner = owner;
  }
  else {
    png_zstream_error(png_ptr,local_80);
  }
  return local_80;
}

Assistant:

static int
png_deflate_claim(png_structrp png_ptr, png_uint_32 owner,
    png_alloc_size_t data_size)
{
   if (png_ptr->zowner != 0)
   {
#if defined(PNG_WARNINGS_SUPPORTED) || defined(PNG_ERROR_TEXT_SUPPORTED)
      char msg[64];

      PNG_STRING_FROM_CHUNK(msg, owner);
      msg[4] = ':';
      msg[5] = ' ';
      PNG_STRING_FROM_CHUNK(msg+6, png_ptr->zowner);
      /* So the message that results is "<chunk> using zstream"; this is an
       * internal error, but is very useful for debugging.  i18n requirements
       * are minimal.
       */
      (void)png_safecat(msg, (sizeof msg), 10, " using zstream");
#endif
#if PNG_RELEASE_BUILD
         png_warning(png_ptr, msg);

         /* Attempt sane error recovery */
         if (png_ptr->zowner == png_IDAT) /* don't steal from IDAT */
         {
            png_ptr->zstream.msg = PNGZ_MSG_CAST("in use by IDAT");
            return Z_STREAM_ERROR;
         }

         png_ptr->zowner = 0;
#else
         png_error(png_ptr, msg);
#endif
   }

   {
      int level = png_ptr->zlib_level;
      int method = png_ptr->zlib_method;
      int windowBits = png_ptr->zlib_window_bits;
      int memLevel = png_ptr->zlib_mem_level;
      int strategy; /* set below */
      int ret; /* zlib return code */

      if (owner == png_IDAT)
      {
         if ((png_ptr->flags & PNG_FLAG_ZLIB_CUSTOM_STRATEGY) != 0)
            strategy = png_ptr->zlib_strategy;

         else if (png_ptr->do_filter != PNG_FILTER_NONE)
            strategy = PNG_Z_DEFAULT_STRATEGY;

         else
            strategy = PNG_Z_DEFAULT_NOFILTER_STRATEGY;
      }

      else
      {
#ifdef PNG_WRITE_CUSTOMIZE_ZTXT_COMPRESSION_SUPPORTED
            level = png_ptr->zlib_text_level;
            method = png_ptr->zlib_text_method;
            windowBits = png_ptr->zlib_text_window_bits;
            memLevel = png_ptr->zlib_text_mem_level;
            strategy = png_ptr->zlib_text_strategy;
#else
            /* If customization is not supported the values all come from the
             * IDAT values except for the strategy, which is fixed to the
             * default.  (This is the pre-1.6.0 behavior too, although it was
             * implemented in a very different way.)
             */
            strategy = Z_DEFAULT_STRATEGY;
#endif
      }

      /* Adjust 'windowBits' down if larger than 'data_size'; to stop this
       * happening just pass 32768 as the data_size parameter.  Notice that zlib
       * requires an extra 262 bytes in the window in addition to the data to be
       * able to see the whole of the data, so if data_size+262 takes us to the
       * next windowBits size we need to fix up the value later.  (Because even
       * though deflate needs the extra window, inflate does not!)
       */
      if (data_size <= 16384)
      {
         /* IMPLEMENTATION NOTE: this 'half_window_size' stuff is only here to
          * work round a Microsoft Visual C misbehavior which, contrary to C-90,
          * widens the result of the following shift to 64-bits if (and,
          * apparently, only if) it is used in a test.
          */
         unsigned int half_window_size = 1U << (windowBits-1);

         while (data_size + 262 <= half_window_size)
         {
            half_window_size >>= 1;
            --windowBits;
         }
      }

      /* Check against the previous initialized values, if any. */
      if ((png_ptr->flags & PNG_FLAG_ZSTREAM_INITIALIZED) != 0 &&
         (png_ptr->zlib_set_level != level ||
         png_ptr->zlib_set_method != method ||
         png_ptr->zlib_set_window_bits != windowBits ||
         png_ptr->zlib_set_mem_level != memLevel ||
         png_ptr->zlib_set_strategy != strategy))
      {
         if (deflateEnd(&png_ptr->zstream) != Z_OK)
            png_warning(png_ptr, "deflateEnd failed (ignored)");

         png_ptr->flags &= ~PNG_FLAG_ZSTREAM_INITIALIZED;
      }

      /* For safety clear out the input and output pointers (currently zlib
       * doesn't use them on Init, but it might in the future).
       */
      png_ptr->zstream.next_in = NULL;
      png_ptr->zstream.avail_in = 0;
      png_ptr->zstream.next_out = NULL;
      png_ptr->zstream.avail_out = 0;

      /* Now initialize if required, setting the new parameters, otherwise just
       * do a simple reset to the previous parameters.
       */
      if ((png_ptr->flags & PNG_FLAG_ZSTREAM_INITIALIZED) != 0)
         ret = deflateReset(&png_ptr->zstream);

      else
      {
         ret = deflateInit2(&png_ptr->zstream, level, method, windowBits,
             memLevel, strategy);

         if (ret == Z_OK)
            png_ptr->flags |= PNG_FLAG_ZSTREAM_INITIALIZED;
      }

      /* The return code is from either deflateReset or deflateInit2; they have
       * pretty much the same set of error codes.
       */
      if (ret == Z_OK)
         png_ptr->zowner = owner;

      else
         png_zstream_error(png_ptr, ret);

      return ret;
   }
}